

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

uint aom_avg_4x4_c(uint8_t *s,int p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = 0;
  for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      iVar1 = iVar1 + (uint)s[lVar3];
    }
    s = s + p;
  }
  return iVar1 + 8 >> 4;
}

Assistant:

unsigned int aom_avg_4x4_c(const uint8_t *s, int p) {
  int i, j;
  int sum = 0;
  for (i = 0; i < 4; ++i, s += p)
    for (j = 0; j < 4; sum += s[j], ++j) {
    }

  return (sum + 8) >> 4;
}